

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::GetThisHelper
              (Var thisVar,TypeId typeId,int moduleID,ScriptContextInfo *scriptContext)

{
  RecyclableObject *pRVar1;
  Var local_18;
  Var thisVar_local;
  
  local_18 = thisVar;
  if (typeId - TypeIds_Boolean < 0x15) {
    pRVar1 = ToObject(thisVar,(ScriptContext *)scriptContext);
    return pRVar1;
  }
  TryLoadRoot(&local_18,typeId,moduleID,scriptContext);
  return local_18;
}

Assistant:

Var JavascriptOperators::GetThisHelper(Var thisVar, TypeId typeId, int moduleID, ScriptContextInfo *scriptContext)
    {
        if (! JavascriptOperators::IsObjectType(typeId) && ! JavascriptOperators::IsUndefinedOrNullType(typeId))
        {
#if ENABLE_NATIVE_CODEGEN
            Assert(!JITManager::GetJITManager()->IsJITServer());
#endif
#if !FLOATVAR
            // We allowed stack number to be used as the "this" for getter and setter activation of
            // n.x and n[prop], where n is the Javascript Number
            return JavascriptOperators::ToObject(
                JavascriptNumber::BoxStackNumber(thisVar, (ScriptContext*)scriptContext), (ScriptContext*)scriptContext);
#else
            return JavascriptOperators::ToObject(thisVar, (ScriptContext*)scriptContext);
#endif

        }
        else
        {
            TryLoadRoot(thisVar, typeId, moduleID, scriptContext);
            return thisVar;
        }
    }